

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void YCSB_F(size_t number,K *random_keys,TestIndex *test_index)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  BufferIndex<double,_long> *pBVar4;
  ostream *poVar5;
  ulong uVar6;
  void *pvVar7;
  size_t sVar8;
  result_type_conflict rVar9;
  void *pvVar10;
  result_type rVar11;
  long lVar12;
  BufferIndex<double,_long> *in_RSI;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar15;
  undefined1 auVar13 [16];
  undefined1 extraout_var [56];
  undefined1 auVar14 [64];
  undefined8 extraout_XMM1_Qb;
  undefined8 uVar18;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  size_t i_3;
  size_t i_2;
  mt19937 gen_temp;
  uniform_int_distribution<unsigned_long> dist_temp;
  P *search_answers;
  timeval t2;
  timeval t1;
  size_t i_1;
  P *new_payloads;
  mt19937 payload_gen;
  uniform_int_distribution<long> payload_dist;
  size_t i;
  Zipfian *zipfian;
  K *search_keys;
  size_t times;
  size_t transactions;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffd7f8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffd800;
  Zipfian *in_stack_ffffffffffffd810;
  BufferIndex<double,_long> *in_stack_ffffffffffffd828;
  ulong local_27c8;
  long local_27c0;
  size_t in_stack_ffffffffffffd888;
  Zipfian *in_stack_ffffffffffffd890;
  long in_stack_ffffffffffffdb90;
  double in_stack_ffffffffffffdb98;
  BufferIndex<double,_long> *in_stack_ffffffffffffdba0;
  timeval local_1418;
  timeval local_1408;
  ulong local_13f8;
  void *local_13f0;
  ulong local_50;
  void *local_38;
  void *local_30;
  ulong local_28;
  undefined8 local_20;
  BufferIndex<double,_long> *local_10;
  
  local_20 = 200000000;
  local_28 = 100000000;
  local_10 = in_RSI;
  poVar5 = std::operator<<((ostream *)&std::cout,"Preparing workloads...");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_28;
  uVar6 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_30 = operator_new__(uVar6);
  pvVar7 = operator_new(0x13c8);
  Zipfian::Zipfian(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888);
  local_38 = pvVar7;
  for (local_50 = 0; local_50 < local_28; local_50 = local_50 + 1) {
    in_stack_ffffffffffffd828 = local_10;
    sVar8 = Zipfian::next(in_stack_ffffffffffffd810);
    *(double *)((long)local_30 + local_50 * 8) =
         (in_stack_ffffffffffffd828->left_buffer).keys[sVar8 - 10];
  }
  pvVar7 = local_38;
  if (local_38 != (void *)0x0) {
    Zipfian::~Zipfian((Zipfian *)0x104681);
    operator_delete(pvVar7,0x13c8);
  }
  std::uniform_int_distribution<long>::uniform_int_distribution
            ((uniform_int_distribution<long> *)in_stack_ffffffffffffd800,
             (long)in_stack_ffffffffffffd7f8,0x1046a9);
  time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(in_stack_ffffffffffffd800,(result_type)in_stack_ffffffffffffd7f8);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_28;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_13f0 = operator_new__(uVar6);
  for (local_13f8 = 0; local_13f8 < local_28; local_13f8 = local_13f8 + 1) {
    rVar9 = std::uniform_int_distribution<long>::operator()
                      ((uniform_int_distribution<long> *)in_stack_ffffffffffffd800,
                       in_stack_ffffffffffffd7f8);
    *(result_type_conflict *)((long)local_13f0 + local_13f8 * 8) = rVar9;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_28;
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar10 = operator_new__(uVar6);
  poVar5 = std::operator<<((ostream *)&std::cout,"Warming up...");
  auVar14._0_8_ = std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  auVar14._8_56_ = extraout_var;
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)in_stack_ffffffffffffd800,
             (unsigned_long)in_stack_ffffffffffffd7f8,0x1047c3);
  time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(in_stack_ffffffffffffd800,(result_type)in_stack_ffffffffffffd7f8);
  local_27c0 = 0;
  while (pBVar4 = local_10, auVar1 = vcvtusi2sd_avx512f(auVar14._0_16_,local_27c0),
        auVar1._0_8_ < 100000000.0) {
    rVar11 = std::uniform_int_distribution<unsigned_long>::operator()
                       ((uniform_int_distribution<unsigned_long> *)in_stack_ffffffffffffd800,
                        in_stack_ffffffffffffd7f8);
    auVar14 = ZEXT864((ulong)(pBVar4->left_buffer).keys[rVar11 - 10]);
    BufferIndex<double,_long>::find(in_stack_ffffffffffffd828,(double)pvVar7);
    local_27c0 = local_27c0 + 1;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Start doing YCSB-F benchmark...");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  uVar15 = extraout_XMM0_Qb;
  uVar18 = extraout_XMM1_Qb;
  gettimeofday(&local_1408,(__timezone_ptr_t)0x0);
  for (local_27c8 = 0; local_27c8 < local_28; local_27c8 = local_27c8 + 1) {
    lVar12 = BufferIndex<double,_long>::find(in_stack_ffffffffffffd828,(double)pvVar7);
    *(long *)((long)pvVar10 + local_27c8 * 8) = lVar12;
    uVar15 = 0;
    BufferIndex<double,_long>::upsert
              (in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,in_stack_ffffffffffffdb90);
  }
  gettimeofday(&local_1418,(__timezone_ptr_t)0x0);
  poVar5 = std::operator<<((ostream *)&std::cout,"Total time: ");
  auVar13._0_8_ = (double)local_1418.tv_sec;
  auVar13._8_8_ = uVar15;
  auVar16._0_8_ = (double)local_1418.tv_usec;
  auVar16._8_8_ = uVar18;
  auVar1 = vfmadd213sd_fma(ZEXT816(0x412e848000000000),auVar13,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = -(double)local_1408.tv_sec;
  auVar1 = vfmadd213sd_fma(ZEXT816(0x412e848000000000),auVar17,auVar1);
  poVar5 = (ostream *)
           std::ostream::operator<<(poVar5,(auVar1._0_8_ - (double)local_1408.tv_usec) / 1000.0);
  poVar5 = std::operator<<(poVar5," ms");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  if (local_30 != (void *)0x0) {
    operator_delete__(local_30);
  }
  if (pvVar10 != (void *)0x0) {
    operator_delete__(pvVar10);
  }
  if (local_13f0 != (void *)0x0) {
    operator_delete__(local_13f0);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"YCSB-F benchmark complete!");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void YCSB_F(const size_t number, const K* random_keys, TestIndex& test_index) {
    size_t transactions = 2e8;
    size_t times = transactions >> 1;

    std::cout<<"Preparing workloads..."<<std::endl;
    K* search_keys = new K[times];
    auto* zipfian = new Zipfian(number);
    for (size_t i = 0; i < times; i++) {
        search_keys[i] = random_keys[zipfian->next()];
    }
    delete zipfian;
    std::uniform_int_distribution<P> payload_dist(-1e9,1e9);
    std::mt19937 payload_gen(time(NULL));
    P* new_payloads = new P[times];
    for (size_t i = 0; i < times; i++) {
        new_payloads[i] = payload_dist(payload_gen);
    }
    timeval t1, t2;
    P* search_answers = new P[times];

    std::cout<<"Warming up..."<<std::endl;
    std::uniform_int_distribution<size_t> dist_temp(0, number - 1);
    std::mt19937 gen_temp(time(NULL));
    for (size_t i = 0; i < 1e8; i++) {
        test_index.find(random_keys[dist_temp(gen_temp)]);
    }

    std::cout<<"Start doing YCSB-F benchmark..."<<std::endl;
    gettimeofday(&t1, NULL);
    for(size_t i = 0; i < times; i++){
        search_answers[i] = test_index.find(search_keys[i]);
        test_index.upsert(search_keys[i], new_payloads[i]);
    }
    gettimeofday(&t2, NULL);
    std::cout<<"Total time: "<<(t2.tv_sec*1e6+t2.tv_usec-t1.tv_sec*1e6-t1.tv_usec)/1000<<" ms"<<std::endl;
    delete [] search_keys;
    delete [] search_answers;
    delete [] new_payloads;
    std::cout<<"YCSB-F benchmark complete!"<<std::endl;
}